

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_do_write_interlace(png_row_infop row_info,png_bytep row,int pass)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  png_bytep ppVar7;
  int iVar8;
  png_byte pVar9;
  uint uVar11;
  bool bVar12;
  uint uVar10;
  
  if (pass < 6) {
    bVar1 = row_info->pixel_depth;
    uVar3 = row_info->width;
    ppVar7 = row;
    if (bVar1 == 4) {
      bVar1 = ""[pass];
      uVar4 = (uint)bVar1;
      if (bVar1 < uVar3) {
        bVar2 = "\b\b\x04\x04\x02\x02\x01"[pass];
        uVar11 = (uint)bVar1;
        do {
          iVar5 = uVar11 * 4;
          iVar8 = 4;
          uVar10 = 0;
          while( true ) {
            uVar10 = (row[uVar11 >> 1] >> (~(byte)iVar5 & 4) & 0xf) << ((byte)iVar8 & 0x1f) | uVar10
            ;
            pVar9 = (png_byte)uVar10;
            if (iVar8 == 0) break;
            iVar8 = iVar8 + -4;
            uVar11 = uVar11 + bVar2;
            iVar5 = iVar5 + (uint)bVar2 * 4;
            if (uVar3 <= uVar11) {
              if (iVar8 == 4) goto LAB_00123187;
              goto LAB_00123184;
            }
          }
          *ppVar7 = pVar9;
          ppVar7 = ppVar7 + 1;
          uVar11 = uVar11 + bVar2;
        } while (uVar11 < uVar3);
      }
    }
    else if (bVar1 == 2) {
      bVar1 = ""[pass];
      uVar4 = (uint)bVar1;
      if (bVar1 < uVar3) {
        bVar2 = "\b\b\x04\x04\x02\x02\x01"[pass];
        uVar11 = (uint)bVar1;
        do {
          iVar5 = uVar11 * 2;
          uVar10 = 0;
          iVar8 = 6;
          while( true ) {
            uVar10 = (row[uVar11 >> 2] >> (~(byte)iVar5 & 6) & 3) << ((byte)iVar8 & 0x1f) | uVar10;
            pVar9 = (png_byte)uVar10;
            if (iVar8 == 0) break;
            iVar8 = iVar8 + -2;
            uVar11 = uVar11 + bVar2;
            iVar5 = iVar5 + (uint)bVar2 + (uint)bVar2;
            if (uVar3 <= uVar11) {
              if (iVar8 == 6) goto LAB_00123187;
              goto LAB_00123184;
            }
          }
          *ppVar7 = pVar9;
          ppVar7 = ppVar7 + 1;
          uVar11 = uVar11 + bVar2;
        } while (uVar11 < uVar3);
      }
    }
    else if (bVar1 == 1) {
      bVar1 = ""[pass];
      uVar4 = (uint)bVar1;
      if (bVar1 < uVar3) {
        bVar2 = "\b\b\x04\x04\x02\x02\x01"[pass];
        uVar11 = (uint)bVar1;
        do {
          uVar10 = 0;
          iVar5 = 7;
          while( true ) {
            uVar10 = (uint)((row[uVar11 >> 3] >> (~(byte)uVar11 & 7) & 1) != 0) <<
                     ((byte)iVar5 & 0x1f) | uVar10;
            pVar9 = (png_byte)uVar10;
            bVar12 = iVar5 == 0;
            iVar5 = iVar5 + -1;
            if (bVar12) break;
            uVar11 = uVar11 + bVar2;
            if (uVar3 <= uVar11) {
              if (iVar5 != 7) {
LAB_00123184:
                *ppVar7 = pVar9;
              }
              goto LAB_00123187;
            }
          }
          *ppVar7 = pVar9;
          ppVar7 = ppVar7 + 1;
          uVar11 = uVar11 + bVar2;
        } while (uVar11 < uVar3);
      }
    }
    else {
      bVar2 = ""[pass];
      uVar4 = (uint)bVar2;
      if (bVar2 < uVar3) {
        uVar6 = (ulong)(bVar1 >> 3);
        bVar1 = "\b\b\x04\x04\x02\x02\x01"[pass];
        uVar4 = (uint)bVar2;
        uVar11 = uVar4;
        do {
          if (ppVar7 != row + uVar11 * uVar6) {
            memcpy(ppVar7,row + uVar11 * uVar6,uVar6);
          }
          ppVar7 = ppVar7 + uVar6;
          uVar11 = uVar11 + bVar1;
        } while (uVar11 < uVar3);
      }
    }
LAB_00123187:
    uVar6 = (ulong)(~uVar4 + row_info->width + (uint)"\b\b\x04\x04\x02\x02\x01"[pass]) /
            (ulong)(uint)"\b\b\x04\x04\x02\x02\x01"[pass];
    row_info->width = (png_uint_32)uVar6;
    bVar1 = row_info->pixel_depth;
    if ((ulong)bVar1 < 8) {
      uVar6 = bVar1 * uVar6 + 7 >> 3;
    }
    else {
      uVar6 = (bVar1 >> 3) * uVar6;
    }
    row_info->rowbytes = uVar6;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_interlace(png_row_infop row_info, png_bytep row, int pass)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static const png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static const png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_write_interlace");

   /* We don't have to do anything on the last pass (6) */
   if (pass < 6)
   {
      /* Each pixel depth is handled separately */
      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            d = 0;
            shift = 7;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 3);
               value = (int)(*sp >> (7 - (int)(i & 0x07))) & 0x01;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 7;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift--;

            }
            if (shift != 7)
               *dp = (png_byte)d;

            break;
         }

         case 2:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 6;
            d = 0;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 2);
               value = (*sp >> ((3 - (int)(i & 0x03)) << 1)) & 0x03;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 6;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 2;
            }
            if (shift != 6)
               *dp = (png_byte)d;

            break;
         }

         case 4:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 4;
            d = 0;
            for (i = png_pass_start[pass]; i < row_width;
                i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 1);
               value = (*sp >> ((1 - (int)(i & 0x01)) << 2)) & 0x0f;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 4;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 4;
            }
            if (shift != 4)
               *dp = (png_byte)d;

            break;
         }

         default:
         {
            png_bytep sp;
            png_bytep dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;
            size_t pixel_bytes;

            /* Start at the beginning */
            dp = row;

            /* Find out how many bytes each pixel takes up */
            pixel_bytes = (row_info->pixel_depth >> 3);

            /* Loop through the row, only looking at the pixels that matter */
            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               /* Find out where the original pixel is */
               sp = row + (size_t)i * pixel_bytes;

               /* Move the pixel */
               if (dp != sp)
                  memcpy(dp, sp, pixel_bytes);

               /* Next pixel */
               dp += pixel_bytes;
            }
            break;
         }
      }
      /* Set new row width */
      row_info->width = (row_info->width +
          png_pass_inc[pass] - 1 -
          png_pass_start[pass]) /
          png_pass_inc[pass];

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
          row_info->width);
   }
}